

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O0

void __thiscall RenX::ExemptionDatabase::upgrade_database(ExemptionDatabase *this)

{
  char *__filename;
  FILE *__stream;
  size_type sVar1;
  reference this_00;
  pointer pEVar2;
  size_t in_RCX;
  size_type local_20;
  size_t index;
  FILE *file;
  ExemptionDatabase *this_local;
  
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&this->m_filename);
  __stream = fopen(__filename,"wb");
  if (__stream != (FILE *)0x0) {
    (**(code **)(*(long *)this + 0x10))(this,__stream);
    local_20 = 0;
    while( true ) {
      sVar1 = std::
              vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
              ::size(&this->m_entries);
      if (sVar1 == 0) break;
      this_00 = std::
                vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
                ::operator[](&this->m_entries,local_20);
      pEVar2 = std::
               unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
               ::get(this_00);
      write(this,(int)pEVar2,__stream,in_RCX);
      local_20 = local_20 + 1;
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void RenX::ExemptionDatabase::upgrade_database() {
	FILE *file = fopen(m_filename.c_str(), "wb");
	if (file != nullptr) {
		this->create_header(file);
		for (size_t index = 0; m_entries.size(); ++index) {
			write(m_entries[index].get(), file);
		}

		fclose(file);
	}
}